

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  char *pcVar1;
  Variant *in_RCX;
  undefined1 local_50 [48];
  string *expr_local;
  SPIRType *expr_type_local;
  CompilerGLSL *this_local;
  
  local_50._40_8_ = in_RCX;
  expr_local = expr;
  expr_type_local = expr_type;
  this_local = this;
  pcVar1 = (char *)::std::__cxx11::string::front();
  if (*pcVar1 == '&') {
    ::std::__cxx11::string::substr((ulong)this,local_50._40_8_);
  }
  else if (((ulong)expr_type[0x19].super_IVariant._vptr_IVariant & 0x100) == 0) {
    if (((*(int *)(expr_local + 0x80) == 0x14e5) && (*(int *)(expr_local + 0xc) != 0xf)) &&
       (*(int *)(expr_local + 0x78) == 1)) {
      enclose_expression((CompilerGLSL *)local_50,(string *)expr_type);
      join<std::__cxx11::string,char_const(&)[7]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [7])".value");
      ::std::__cxx11::string::~string((string *)local_50);
    }
    else {
      ::std::__cxx11::string::string((string *)this,(string *)local_50._40_8_);
    }
  }
  else {
    local_50[0x27] = 0x2a;
    join<char,std::__cxx11::string_const&>
              ((spirv_cross *)this,local_50 + 0x27,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._40_8_)
    ;
  }
  return this;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (expr_type.storage == StorageClassPhysicalStorageBufferEXT && expr_type.basetype != SPIRType::Struct &&
	         expr_type.pointer_depth == 1)
	{
		return join(enclose_expression(expr), ".value");
	}
	else
		return expr;
}